

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall google::protobuf::FieldDescriptor::is_packed(FieldDescriptor *this)

{
  bool bVar1;
  Syntax SVar2;
  long in_RDI;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 local_1;
  
  bVar1 = is_packable((FieldDescriptor *)
                      CONCAT17(in_stack_ffffffffffffffe7,
                               CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
  if (bVar1) {
    SVar2 = FileDescriptor::syntax(*(FileDescriptor **)(in_RDI + 0x28));
    if (SVar2 == SYNTAX_PROTO2) {
      local_1 = false;
      if (*(long *)(in_RDI + 0x78) != 0) {
        local_1 = FieldOptions::packed((FieldOptions *)0x4be369);
      }
    }
    else {
      local_1 = true;
      if (*(long *)(in_RDI + 0x78) != 0) {
        bVar1 = FieldOptions::has_packed((FieldOptions *)0x4be399);
        local_1 = true;
        if (bVar1) {
          local_1 = FieldOptions::packed((FieldOptions *)0x4be3b6);
        }
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool FieldDescriptor::is_packed() const {
  if (!is_packable()) return false;
  if (file_->syntax() == FileDescriptor::SYNTAX_PROTO2) {
    return (options_ != nullptr) && options_->packed();
  } else {
    return options_ == nullptr || !options_->has_packed() || options_->packed();
  }
}